

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LSTMParams * __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_params
          (UniDirectionalLSTMLayerParams *this)

{
  LSTMParams *this_00;
  UniDirectionalLSTMLayerParams *this_local;
  
  if (this->params_ == (LSTMParams *)0x0) {
    this_00 = (LSTMParams *)operator_new(0x20);
    LSTMParams::LSTMParams(this_00);
    this->params_ = this_00;
  }
  return this->params_;
}

Assistant:

inline ::CoreML::Specification::LSTMParams* UniDirectionalLSTMLayerParams::mutable_params() {
  
  if (params_ == NULL) {
    params_ = new ::CoreML::Specification::LSTMParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.UniDirectionalLSTMLayerParams.params)
  return params_;
}